

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# red_black_tree.cpp
# Opt level: O0

rbtree_node_base * eastl::RBTreeDecrement(rbtree_node_base *pNode)

{
  this_type *local_28;
  rbtree_node_base *pNodeTemp;
  rbtree_node_base *pNodeTemp_1;
  rbtree_node_base *pNode_local;
  
  if ((pNode->mpNodeParent->mpNodeParent == pNode) && (pNode->mColor == '\0')) {
    pNode_local = pNode->mpNodeRight;
  }
  else if (pNode->mpNodeLeft == (this_type *)0x0) {
    pNodeTemp_1 = pNode;
    for (local_28 = pNode->mpNodeParent; pNodeTemp_1 == local_28->mpNodeLeft;
        local_28 = local_28->mpNodeParent) {
      pNodeTemp_1 = local_28;
    }
    pNode_local = local_28;
  }
  else {
    for (pNodeTemp = pNode->mpNodeLeft; pNodeTemp->mpNodeRight != (this_type *)0x0;
        pNodeTemp = pNodeTemp->mpNodeRight) {
    }
    pNode_local = pNodeTemp;
  }
  return pNode_local;
}

Assistant:

EASTL_API rbtree_node_base* RBTreeDecrement(const rbtree_node_base* pNode)
    {
        if((pNode->mpNodeParent->mpNodeParent == pNode) && (pNode->mColor == kRBTreeColorRed))
            return pNode->mpNodeRight;
        else if(pNode->mpNodeLeft)
        {
            rbtree_node_base* pNodeTemp = pNode->mpNodeLeft;

            while(pNodeTemp->mpNodeRight)
                pNodeTemp = pNodeTemp->mpNodeRight;

            return pNodeTemp;
        }

        rbtree_node_base* pNodeTemp = pNode->mpNodeParent;

        while(pNode == pNodeTemp->mpNodeLeft) 
        {
            pNode     = pNodeTemp;
            pNodeTemp = pNodeTemp->mpNodeParent;
        }

        return const_cast<rbtree_node_base*>(pNodeTemp);
    }